

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cpp
# Opt level: O0

void __thiscall Sequence::Sequence(Sequence *this,int t_size)

{
  long lVar1;
  anon_class_5008_2_615ce6dd *paVar2;
  param_type *ppVar3;
  byte bVar4;
  param_type apStack_27f8 [627];
  deque<int,_std::allocator<int>_> *local_1460;
  deque<int,_std::allocator<int>_> *local_1458;
  Sequence *local_1450;
  deque<int,_std::allocator<int>_> *local_1448;
  size_type local_1440;
  allocator_type *local_1438;
  undefined1 local_1430 [32];
  anon_class_5008_2_615ce6dd local_1410;
  anon_class_1_0_00000001 local_7d [8];
  anon_class_1_0_00000001 rand_between;
  allocator<int> local_69;
  deque<int,_std::allocator<int>_> local_68;
  int local_14;
  Sequence *pSStack_10;
  int t_size_local;
  Sequence *this_local;
  
  bVar4 = 0;
  this->_vptr_Sequence = (_func_int **)&PTR_shift_00127d10;
  local_1448 = &this->m_bits;
  local_1450 = this;
  local_14 = t_size;
  pSStack_10 = this;
  std::deque<int,_std::allocator<int>_>::deque(local_1448);
  local_1440 = (size_type)local_14;
  local_1438 = &local_69;
  std::allocator<int>::allocator(local_1438);
  std::deque<int,_std::allocator<int>_>::deque(&local_68,local_1440,local_1438);
  local_1460 = &local_1450->m_bits;
  local_1458 = &local_68;
  std::deque<int,_std::allocator<int>_>::operator=(local_1460,local_1458);
  std::deque<int,_std::allocator<int>_>::~deque(local_1458);
  std::allocator<int>::~allocator(&local_69);
  local_7d[0] = (anon_class_1_0_00000001)0x0;
  Sequence::anon_class_1_0_00000001::operator()(&local_1410,local_7d,0,1);
  paVar2 = &local_1410;
  ppVar3 = apStack_27f8;
  for (lVar1 = 0x272; lVar1 != 0; lVar1 = lVar1 + -1) {
    *ppVar3 = (paVar2->distribution_)._M_param;
    paVar2 = (anon_class_5008_2_615ce6dd *)((long)paVar2 + ((ulong)bVar4 * -2 + 1) * 8);
    ppVar3 = ppVar3 + (ulong)bVar4 * -2 + 1;
  }
  std::ranges::__generate_fn::
  operator()<std::deque<int,_std::allocator<int>_>_&,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Spriithy[P]3des_cpp_3des_Sequence_cpp:12:24)>
            (local_1430,(__generate_fn *)&std::ranges::generate,local_1460);
  return;
}

Assistant:

Sequence::Sequence(int t_size) {
    m_bits = std::deque<int>(t_size);

    // Lambda function to generate random bits
    auto rand_between = [](int low, int high) {
        auto wrapped = [distribution_ = std::uniform_int_distribution<int>(low, high),
                        random_engine_ = std::mt19937{std::random_device{}()}]() mutable {
            return distribution_(random_engine_);
        };
        return wrapped;
    };

    std::ranges::generate(m_bits, rand_between(0, 1));
}